

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.hpp
# Opt level: O0

Ptr<Buffer>
myvk::Buffer::CreateStaging<float*>
          (Ptr<Device> *device,float *begin,float *end,
          vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
          *access_queues)

{
  Buffer *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 in_RSI;
  element_type *in_RDI;
  float *in_R8;
  Ptr<Buffer> PVar1;
  VkDeviceSize unaff_retaddr;
  Ptr<Device> *in_stack_00000008;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
  *in_stack_00000020;
  Ptr<Buffer> *ret;
  uint32_t in_stack_ffffffffffffffcc;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar2;
  
  uVar2 = 0;
  Create(in_stack_00000008,unaff_retaddr,(VmaAllocationCreateFlags)((ulong)in_RDI >> 0x20),
         (VkBufferUsageFlags)in_RDI,(VmaMemoryUsage)((ulong)in_RSI >> 0x20),in_stack_00000020);
  std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x16aa5c
            );
  UpdateData<float*>(in_RCX,in_R8,(float *)CONCAT17(uVar2,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc);
  PVar1.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<Buffer>)PVar1.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Ptr<Buffer> CreateStaging(const Ptr<Device> &device, Iter begin, Iter end,
	                                 const std::vector<Ptr<Queue>> &access_queues = {}) {
		using T = typename std::iterator_traits<Iter>::value_type;
		Ptr<Buffer> ret =
		    Create(device, (end - begin) * sizeof(T),
		           VMA_ALLOCATION_CREATE_MAPPED_BIT | VMA_ALLOCATION_CREATE_HOST_ACCESS_SEQUENTIAL_WRITE_BIT,
		           VK_BUFFER_USAGE_TRANSFER_SRC_BIT, VMA_MEMORY_USAGE_AUTO, access_queues);
		ret->UpdateData(begin, end, 0);
		return ret;
	}